

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixml.c
# Opt level: O0

void ixmlPrintDomTreeRecursive(IXML_Node *nodeptr,ixml_membuf *buf)

{
  unsigned_short uVar1;
  char *c_str;
  char *p;
  IXML_Node *pIVar2;
  IXML_Node *sibling;
  IXML_Node *child;
  char *nodeValue;
  char *nodeName;
  ixml_membuf *buf_local;
  IXML_Node *nodeptr_local;
  
  if (nodeptr != (IXML_Node *)0x0) {
    c_str = ixmlNode_getNodeName(nodeptr);
    p = ixmlNode_getNodeValue(nodeptr);
    uVar1 = ixmlNode_getNodeType(nodeptr);
    switch(uVar1) {
    case 1:
      ixml_membuf_append_str(buf,"<");
      ixml_membuf_append_str(buf,c_str);
      if (nodeptr->firstAttr != (Nodeptr)0x0) {
        ixml_membuf_append_str(buf," ");
        ixmlPrintDomTreeRecursive(nodeptr->firstAttr,buf);
      }
      pIVar2 = ixmlNode_getFirstChild(nodeptr);
      if ((pIVar2 == (IXML_Node *)0x0) || (uVar1 = ixmlNode_getNodeType(pIVar2), uVar1 != 1)) {
        ixml_membuf_append_str(buf,">");
      }
      else {
        ixml_membuf_append_str(buf,">\r\n");
      }
      pIVar2 = ixmlNode_getFirstChild(nodeptr);
      ixmlPrintDomTreeRecursive(pIVar2,buf);
      ixml_membuf_append_str(buf,"</");
      ixml_membuf_append_str(buf,c_str);
      pIVar2 = ixmlNode_getNextSibling(nodeptr);
      if ((pIVar2 == (IXML_Node *)0x0) || (uVar1 = ixmlNode_getNodeType(pIVar2), uVar1 != 3)) {
        ixml_membuf_append_str(buf,">\r\n");
      }
      else {
        ixml_membuf_append_str(buf,">");
      }
      pIVar2 = ixmlNode_getNextSibling(nodeptr);
      ixmlPrintDomTreeRecursive(pIVar2,buf);
      break;
    case 2:
      ixml_membuf_append_str(buf,c_str);
      ixml_membuf_append_str(buf,"=\"");
      copy_with_escape(buf,p);
      ixml_membuf_append_str(buf,"\"");
      if (nodeptr->nextSibling != (Nodeptr)0x0) {
        ixml_membuf_append_str(buf," ");
        ixmlPrintDomTreeRecursive(nodeptr->nextSibling,buf);
      }
      break;
    case 3:
      copy_with_escape(buf,p);
      break;
    case 4:
      ixml_membuf_append_str(buf,"<![CDATA[");
      ixml_membuf_append_str(buf,p);
      ixml_membuf_append_str(buf,"]]>");
      break;
    default:
      uVar1 = ixmlNode_getNodeType(nodeptr);
      IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixml.c",
                 0xaf,"ixmlPrintDomTreeRecursive","Warning, unknown node type %d\n",(ulong)uVar1);
      break;
    case 7:
      ixml_membuf_append_str(buf,"<?");
      ixml_membuf_append_str(buf,c_str);
      ixml_membuf_append_str(buf," ");
      copy_with_escape(buf,p);
      ixml_membuf_append_str(buf,"?>\n");
      break;
    case 9:
      pIVar2 = ixmlNode_getFirstChild(nodeptr);
      ixmlPrintDomTreeRecursive(pIVar2,buf);
    }
  }
  return;
}

Assistant:

static void ixmlPrintDomTreeRecursive(
	/*! [in] \todo documentation. */
	IXML_Node *nodeptr,
	/*! [in] \todo documentation. */
	ixml_membuf *buf)
{
	const char *nodeName = NULL;
	const char *nodeValue = NULL;
	IXML_Node *child = NULL, *sibling = NULL;

	if (nodeptr != NULL) {
		nodeName = (const char *)ixmlNode_getNodeName(nodeptr);
		nodeValue = ixmlNode_getNodeValue(nodeptr);

		switch (ixmlNode_getNodeType(nodeptr)) {
		case eTEXT_NODE:
			copy_with_escape(buf, nodeValue);
			break;

		case eCDATA_SECTION_NODE:
			ixml_membuf_append_str(buf, "<![CDATA[");
			ixml_membuf_append_str(buf, nodeValue);
			ixml_membuf_append_str(buf, "]]>");
			break;

		case ePROCESSING_INSTRUCTION_NODE:
			ixml_membuf_append_str(buf, "<?");
			ixml_membuf_append_str(buf, nodeName);
			ixml_membuf_append_str(buf, " ");
			copy_with_escape(buf, nodeValue);
			ixml_membuf_append_str(buf, "?>\n");
			break;

		case eDOCUMENT_NODE:
			ixmlPrintDomTreeRecursive(
				ixmlNode_getFirstChild(nodeptr), buf);
			break;

		case eATTRIBUTE_NODE:
			ixml_membuf_append_str(buf, nodeName);
			ixml_membuf_append_str(buf, "=\"");
			copy_with_escape(buf, nodeValue);
			ixml_membuf_append_str(buf, "\"");
			if (nodeptr->nextSibling != NULL) {
				ixml_membuf_append_str(buf, " ");
				ixmlPrintDomTreeRecursive(
					nodeptr->nextSibling, buf);
			}
			break;

		case eELEMENT_NODE:
			ixml_membuf_append_str(buf, "<");
			ixml_membuf_append_str(buf, nodeName);
			if (nodeptr->firstAttr != NULL) {
				ixml_membuf_append_str(buf, " ");
				ixmlPrintDomTreeRecursive(
					nodeptr->firstAttr, buf);
			}
			child = ixmlNode_getFirstChild(nodeptr);
			if (child != NULL &&
				ixmlNode_getNodeType(child) == eELEMENT_NODE) {
				ixml_membuf_append_str(buf, ">\r\n");
			} else {
				ixml_membuf_append_str(buf, ">");
			}
			/* output the children */
			ixmlPrintDomTreeRecursive(
				ixmlNode_getFirstChild(nodeptr), buf);

			/* Done with children.  Output the end tag. */
			ixml_membuf_append_str(buf, "</");
			ixml_membuf_append_str(buf, nodeName);

			sibling = ixmlNode_getNextSibling(nodeptr);
			if (sibling != NULL &&
				ixmlNode_getNodeType(sibling) == eTEXT_NODE) {
				ixml_membuf_append_str(buf, ">");
			} else {
				ixml_membuf_append_str(buf, ">\r\n");
			}
			ixmlPrintDomTreeRecursive(
				ixmlNode_getNextSibling(nodeptr), buf);
			break;

		default:
			IxmlPrintf(__FILE__,
				__LINE__,
				"ixmlPrintDomTreeRecursive",
				"Warning, unknown node type %d\n",
				(int)ixmlNode_getNodeType(nodeptr));
			break;
		}
	}
}